

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
write_padded<fmt::v6::internal::nonfinite_writer<wchar_t>>
          (basic_writer<fmt::v6::buffer_range<wchar_t>> *this,format_specs *specs,
          nonfinite_writer<wchar_t> *f)

{
  fill_t<wchar_t> *fill;
  byte bVar1;
  ulong uVar2;
  size_t n;
  checked_ptr<typename_buffer<wchar_t>::value_type> local_30;
  
  uVar2 = 4 - (ulong)(f->sign == none);
  n = (uint)specs->width - uVar2;
  if ((uint)specs->width < uVar2 || n == 0) {
    local_30 = reserve<fmt::v6::internal::buffer<wchar_t>,_0>
                         ((back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_> *)this,uVar2);
    nonfinite_writer<wchar_t>::operator()(f,&local_30);
  }
  else {
    fill = &specs->fill;
    local_30 = reserve<fmt::v6::internal::buffer<wchar_t>,_0>
                         ((back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_> *)this,
                          (specs->fill).size_ * n + uVar2);
    bVar1 = specs->field_0x9 & 0xf;
    if (bVar1 == 3) {
      uVar2 = n >> 1 & 0x7fffffff;
      local_30 = fill<wchar_t*,wchar_t>(local_30,uVar2,fill);
      nonfinite_writer<wchar_t>::operator()(f,&local_30);
      n = n - uVar2;
    }
    else {
      if (bVar1 == 2) {
        local_30 = fill<wchar_t*,wchar_t>(local_30,n,fill);
        nonfinite_writer<wchar_t>::operator()(f,&local_30);
        return;
      }
      nonfinite_writer<wchar_t>::operator()(f,&local_30);
    }
    fill<wchar_t*,wchar_t>(local_30,n,fill);
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    size_t padding = width - num_code_points;
    size_t fill_size = specs.fill.size();
    auto&& it = reserve(size + padding * fill_size);
    if (specs.align == align::right) {
      it = fill(it, padding, specs.fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = fill(it, left_padding, specs.fill);
      f(it);
      it = fill(it, padding - left_padding, specs.fill);
    } else {
      f(it);
      it = fill(it, padding, specs.fill);
    }
  }